

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_vector_dense.cpp
# Opt level: O0

void __thiscall
test_vector_dense_constructors_initialiser_lists_Test::TestBody
          (test_vector_dense_constructors_initialiser_lists_Test *this)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  reference pvVar5;
  reference pvVar6;
  char *regex;
  AssertHelper local_278;
  Message local_270;
  int local_264;
  exception *gtest_exception;
  undefined8 uStack_230;
  undefined8 local_228;
  initializer_list<double> local_218;
  Vector_Dense<double,_4UL> local_208;
  ReturnSentinel local_1e8;
  ReturnSentinel gtest_sentinel;
  unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
  gtest_dt_ptr;
  pointer local_1c0;
  DeathTest *gtest_dt;
  Message local_1b0;
  undefined1 local_1a8 [8];
  AssertionResult gtest_ar_7;
  Message local_190;
  undefined1 local_188 [8];
  AssertionResult gtest_ar_6;
  Message local_170;
  undefined1 local_168 [8];
  AssertionResult gtest_ar_5;
  initializer_list<double> local_140;
  undefined1 local_130 [8];
  Vector_Dense<double,_3UL> static_vector;
  Message local_110;
  undefined1 local_108 [8];
  AssertionResult gtest_ar_4;
  Message local_f0;
  undefined1 local_e8 [8];
  AssertionResult gtest_ar_3;
  Message local_d0;
  undefined1 local_c8 [8];
  AssertionResult gtest_ar_2;
  Message local_b0;
  undefined1 local_a8 [8];
  AssertionResult gtest_ar_1;
  Message local_90 [3];
  int local_74;
  size_type local_70;
  undefined1 local_68 [8];
  AssertionResult gtest_ar;
  initializer_list<double> local_38;
  undefined1 local_28 [8];
  Vector_Dense<double,_0UL> dynamic_vector;
  test_vector_dense_constructors_initialiser_lists_Test *this_local;
  
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x3ff0000000000000;
  local_38._M_array = (iterator)&gtest_ar.message_;
  local_38._M_len = 4;
  dynamic_vector.super_vector<double,_std::allocator<double>_>.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)this;
  Disa::Vector_Dense<double,_0UL>::Vector_Dense((Vector_Dense<double,_0UL> *)local_28,&local_38);
  local_70 = std::vector<double,_std::allocator<double>_>::size
                       ((vector<double,_std::allocator<double>_> *)local_28);
  local_74 = 4;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_68,"dynamic_vector.size()","4",&local_70,&local_74);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_68);
  if (!bVar1) {
    testing::Message::Message(local_90);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_68);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_vector_dense.cpp"
               ,0x23,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_68);
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_28,0);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_a8,"dynamic_vector[0]","1.0",*pvVar5,1.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a8);
  if (!bVar1) {
    testing::Message::Message(&local_b0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_vector_dense.cpp"
               ,0x24,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a8);
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_28,1);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_c8,"dynamic_vector[1]","3.0",*pvVar5,3.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
  if (!bVar1) {
    testing::Message::Message(&local_d0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_vector_dense.cpp"
               ,0x25,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_28,2);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_e8,"dynamic_vector[2]","4.0",*pvVar5,4.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e8);
  if (!bVar1) {
    testing::Message::Message(&local_f0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_vector_dense.cpp"
               ,0x26,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e8);
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_28,3);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_108,"dynamic_vector[3]","-8.0",*pvVar5,-8.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_108);
  if (!bVar1) {
    testing::Message::Message(&local_110);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_108);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)(static_vector.super_array<double,_3UL>._M_elems + 2),
               kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_vector_dense.cpp"
               ,0x27,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)(static_vector.super_array<double,_3UL>._M_elems + 2),&local_110);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)(static_vector.super_array<double,_3UL>._M_elems + 2));
    testing::Message::~Message(&local_110);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_108);
  gtest_ar_5.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0xc041000000000000;
  local_140._M_array = (iterator)&gtest_ar_5.message_;
  local_140._M_len = 3;
  Disa::Vector_Dense<double,_3UL>::Vector_Dense((Vector_Dense<double,_3UL> *)local_130,&local_140);
  pvVar6 = std::array<double,_3UL>::operator[]((array<double,_3UL> *)local_130,0);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_168,"static_vector[0]","-34.0",*pvVar6,-34.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_168);
  if (!bVar1) {
    testing::Message::Message(&local_170);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_168);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_vector_dense.cpp"
               ,0x2a,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_170);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_170);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_168);
  pvVar6 = std::array<double,_3UL>::operator[]((array<double,_3UL> *)local_130,1);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_188,"static_vector[1]","56.0",*pvVar6,56.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_188);
  if (!bVar1) {
    testing::Message::Message(&local_190);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_188);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_vector_dense.cpp"
               ,0x2b,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_190);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_190);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_188);
  pvVar6 = std::array<double,_3UL>::operator[]((array<double,_3UL> *)local_130,2);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_1a8,"static_vector[2]","23.0",*pvVar6,23.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a8);
  if (!bVar1) {
    testing::Message::Message(&local_1b0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_vector_dense.cpp"
               ,0x2c,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt,&local_1b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt);
    testing::Message::~Message(&local_1b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a8);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr,(internal *)"./*",regex);
    bVar1 = testing::internal::DeathTest::Create
                      ("(Vector_Dense<Scalar, 4>({-34.0, 56.0, 23.0}))",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&gtest_dt_ptr,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_vector_dense.cpp"
                       ,0x2e,&local_1c0);
    testing::
    Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~Matcher((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      if (local_1c0 == (pointer)0x0) goto LAB_0010f1a4;
      std::
      unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>::
      unique_ptr<std::default_delete<testing::internal::DeathTest>,void>
                ((unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>
                  *)&gtest_sentinel,local_1c0);
      iVar2 = (*local_1c0->_vptr_DeathTest[2])();
      if (iVar2 == 0) {
        iVar2 = (*local_1c0->_vptr_DeathTest[3])();
        bVar1 = testing::internal::ExitedUnsuccessfully(iVar2);
        uVar3 = (*local_1c0->_vptr_DeathTest[4])(local_1c0,(ulong)bVar1);
        if ((uVar3 & 1) != 0) goto LAB_0010f0c1;
        local_264 = 2;
      }
      else {
        if (iVar2 == 1) {
          testing::internal::DeathTest::ReturnSentinel::ReturnSentinel(&local_1e8,local_1c0);
          bVar1 = testing::internal::AlwaysTrue();
          if (bVar1) {
            gtest_exception = (exception *)0xc041000000000000;
            uStack_230 = 0x404c000000000000;
            local_228 = 0x4037000000000000;
            local_218._M_array = (iterator)&gtest_exception;
            local_218._M_len = 3;
            Disa::Vector_Dense<double,_4UL>::Vector_Dense(&local_208,&local_218);
          }
          (*local_1c0->_vptr_DeathTest[5])(local_1c0,2);
          testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel(&local_1e8);
        }
LAB_0010f0c1:
        local_264 = 0;
      }
      std::
      unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>::
      ~unique_ptr((unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
                   *)&gtest_sentinel);
      if (local_264 == 0) goto LAB_0010f1a4;
    }
  }
  testing::Message::Message(&local_270);
  pcVar4 = testing::internal::DeathTest::LastMessage();
  testing::internal::AssertHelper::AssertHelper
            (&local_278,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_vector_dense.cpp"
             ,0x2e,pcVar4);
  testing::internal::AssertHelper::operator=(&local_278,&local_270);
  testing::internal::AssertHelper::~AssertHelper(&local_278);
  testing::Message::~Message(&local_270);
LAB_0010f1a4:
  Disa::Vector_Dense<double,_0UL>::~Vector_Dense((Vector_Dense<double,_0UL> *)local_28);
  return;
}

Assistant:

TEST(test_vector_dense, constructors_initialiser_lists) {
  Vector_Dense<Scalar, 0> dynamic_vector = {1.0, 3.0, 4.0, -8.0};
  EXPECT_EQ(dynamic_vector.size(), 4);
  EXPECT_DOUBLE_EQ(dynamic_vector[0], 1.0);
  EXPECT_DOUBLE_EQ(dynamic_vector[1], 3.0);
  EXPECT_DOUBLE_EQ(dynamic_vector[2], 4.0);
  EXPECT_DOUBLE_EQ(dynamic_vector[3], -8.0);

  Vector_Dense<Scalar, 3> static_vector = {-34.0, 56.0, 23.0};
  EXPECT_DOUBLE_EQ(static_vector[0], -34.0);
  EXPECT_DOUBLE_EQ(static_vector[1], 56.0);
  EXPECT_DOUBLE_EQ(static_vector[2], 23.0);

  EXPECT_DEATH((Vector_Dense<Scalar, 4>({-34.0, 56.0, 23.0})), "./*");
}